

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O0

_Bool check_add_int32_int64(int32_t a,int64_t b,int32_t *ret)

{
  int iVar1;
  long in;
  undefined4 *in_RDX;
  long in_RSI;
  int in_EDI;
  int64_t tmp;
  
  in = in_EDI + in_RSI;
  *in_RDX = (int)in;
  if (in_EDI < 0) {
    if ((in_RSI < 0) && (in_EDI < in)) {
      return false;
    }
  }
  else if ((-1 < in_RSI) && (in < in_EDI)) {
    return false;
  }
  iVar1 = check_cast_int32_int64(in);
  return iVar1 == 0;
}

Assistant:

static inline bool check_add_int32_int64(int32_t a, int64_t b, int32_t* ret)
{
    int64_t tmp = (int64_t)((uint64_t)a + (uint64_t)b);
    *ret = (int32_t)tmp;

    if (a >= 0)
    {
        // mixed sign cannot overflow
        if (b >= 0 && tmp < a)
            return false;
    }
    else
    {
        // lhs negative
        if (b < 0 && tmp > a)
            return false;
    }

    return check_cast_int32_int64(tmp) == 0;
}